

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

void __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::add(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
      *this,Node *node,size_t depth,Box<float> *box,Node **value)

{
  float *pfVar1;
  Node **nodeBox;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  pointer node_00;
  Box<float> local_54;
  Box<float> local_44;
  int local_34;
  Node **ppNStack_30;
  int i;
  Node **value_local;
  Box<float> *box_local;
  size_t depth_local;
  Node *node_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  ppNStack_30 = value;
  value_local = (Node **)box;
  box_local = (Box<float> *)depth;
  depth_local = (size_t)node;
  node_local = (Node *)this;
  bVar2 = isLeaf(this,node);
  nodeBox = value_local;
  if (bVar2) {
    if ((box_local < (Box<float> *)0x8) &&
       (sVar3 = std::vector<Node_*,_std::allocator<Node_*>_>::size
                          ((vector<Node_*,_std::allocator<Node_*>_> *)(depth_local + 0x20)),
       0xf < sVar3)) {
      split(this,(Node *)depth_local,(Box<float> *)value_local);
      add(this,(Node *)depth_local,(size_t)box_local,(Box<float> *)value_local,ppNStack_30);
    }
    else {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)(depth_local + 0x20),ppNStack_30);
    }
  }
  else {
    local_44 = anon_class_1_0_00000001_for_mGetBox::operator()
                         ((anon_class_1_0_00000001_for_mGetBox *)&this->field_0x18,*ppNStack_30);
    local_34 = getQuadrant(this,(Box<float> *)nodeBox,&local_44);
    if (local_34 == -1) {
      std::vector<Node_*,_std::allocator<Node_*>_>::push_back
                ((vector<Node_*,_std::allocator<Node_*>_> *)(depth_local + 0x20),ppNStack_30);
    }
    else {
      this_00 = std::
                array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                ::operator[]((array<std::unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>,_4UL>
                              *)depth_local,(long)local_34);
      node_00 = std::
                unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
                ::get(this_00);
      pfVar1 = &box_local->left;
      local_54 = computeBox(this,(Box<float> *)value_local,local_34);
      add(this,node_00,(size_t)((long)pfVar1 + 1),&local_54,ppNStack_30);
    }
  }
  return;
}

Assistant:

void add(Node* node, std::size_t depth, const Box<Float>& box, const T& value)
    {
        assert(node != nullptr);
        assert(box.contains(mGetBox(value)));
        if (isLeaf(node))
        {
            // Insert the value in this node if possible
            if (depth >= MaxDepth || node->values.size() < Threshold)
                node->values.push_back(value);
            // Otherwise, we split and we try again
            else
            {
                split(node, box);
                add(node, depth, box, value);
            }
        }
        else
        {
            auto i = getQuadrant(box, mGetBox(value));
            // Add the value in a child if the value is entirely contained in it
            if (i != -1)
                add(node->children[static_cast<std::size_t>(i)].get(), depth + 1, computeBox(box, i), value);
            // Otherwise, we add the value in the current node
            else
                node->values.push_back(value);
        }
    }